

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O0

void WRITE_EA_PACK(int ea,int k,floatx80 fpr)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  floatx80 fpr_00;
  floatx80 fpr_01;
  floatx80 fpr_02;
  uint32 ea_3;
  uint32 ea_2;
  uint32 ea_1;
  int reg;
  int mode;
  int k_local;
  int ea_local;
  floatx80 fpr_local;
  
  fpr_00.low = fpr.low;
  uVar1 = fpr.high;
  uVar2 = (uint)ea >> 3 & 7;
  uVar3 = ea & 7;
  switch(uVar2) {
  case 2:
    fpr_00._2_6_ = 0;
    fpr_00.high = uVar1;
    store_pack_float80(m68ki_cpu.dar[(long)(int)uVar3 + 8],k,fpr_00);
    break;
  case 3:
    fpr_01._2_6_ = 0;
    fpr_01.high = uVar1;
    fpr_01.low = fpr_00.low;
    store_pack_float80(m68ki_cpu.dar[(long)(int)uVar3 + 8],k,fpr_01);
    m68ki_cpu.dar[(long)(int)uVar3 + 8] = m68ki_cpu.dar[(long)(int)uVar3 + 8] + 0xc;
    break;
  case 4:
    m68ki_cpu.dar[(long)(int)uVar3 + 8] = m68ki_cpu.dar[(long)(int)uVar3 + 8] - 0xc;
    fpr_02._2_6_ = 0;
    fpr_02.high = uVar1;
    fpr_02.low = fpr_00.low;
    store_pack_float80(m68ki_cpu.dar[(long)(int)uVar3 + 8],k,fpr_02);
    break;
  default:
    fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n",(ulong)uVar2,
               (ulong)uVar3,(ulong)m68ki_cpu.pc);
    break;
  case 7:
    fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n",(ulong)uVar2,
               (ulong)uVar3,(ulong)m68ki_cpu.pc);
  }
  return;
}

Assistant:

static void WRITE_EA_PACK(int ea, int k, floatx80 fpr)
{
	int mode = (ea >> 3) & 0x7;
	int reg = (ea & 0x7);

	switch (mode)
	{
		case 2:		// (An)
		{
			uint32 ea;
			ea = REG_A[reg];
			store_pack_float80(ea, k, fpr);
			break;
		}

		case 3:		// (An)+
		{
			uint32 ea;
			ea = REG_A[reg];
			store_pack_float80(ea, k, fpr);
			REG_A[reg] += 12;
			break;
		}

		case 4:		// -(An)
		{
			uint32 ea;
			REG_A[reg] -= 12;
			ea = REG_A[reg];
			store_pack_float80(ea, k, fpr);
			break;
		}

		case 7:
		{
			switch (reg)
			{
				default:	fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n", mode, reg, REG_PC);
			}
		}
		break;
		default:	fatalerror("M68kFPU: WRITE_EA_PACK: unhandled mode %d, reg %d, at %08X\n", mode, reg, REG_PC);
	}
}